

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O0

bool __thiscall draco::PointCloudDecoder::DecodePointAttributes(PointCloudDecoder *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer pAVar6;
  size_type sVar7;
  reference pvVar8;
  DecoderBuffer *in_RDI;
  int att_id;
  int j;
  int32_t num_attributes;
  int i_2;
  int i_1;
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  *att_dec;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
  *__range1;
  int i;
  uint8_t num_attributes_decoders;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  value_type vVar9;
  __normal_iterator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_*,_std::vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  value_type vVar10;
  int iVar11;
  __normal_iterator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_*,_std::vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>_>
  local_28;
  int64_t *local_20;
  int local_18;
  byte local_11;
  bool local_1;
  
  bVar1 = DecoderBuffer::Decode<unsigned_char>(in_RDI,(uchar *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    for (local_18 = 0; local_18 < (int)(uint)local_11; local_18 = local_18 + 1) {
      uVar5 = (**(code **)(in_RDI->data_ + 0x20))(in_RDI,local_18);
      if ((uVar5 & 1) == 0) {
        return false;
      }
    }
    local_20 = &in_RDI->pos_;
    local_28._M_current =
         (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
          *)std::
            vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
            ::begin((vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::
    vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
    ::end((vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffffa0,
                              (__normal_iterator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_*,_std::vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_*,_std::vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>_>
      ::operator*(&local_28);
      pAVar6 = std::
               unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
               ::operator->((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                             *)0x1ad86a);
      uVar2 = (*pAVar6->_vptr_AttributesDecoderInterface[2])(pAVar6,in_RDI,in_RDI->data_size_);
      if ((uVar2 & 1) == 0) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_*,_std::vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>_>
      ::operator++(&local_28);
    }
    for (iVar11 = 0; iVar11 < (int)(uint)local_11; iVar11 = iVar11 + 1) {
      std::
      vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                    *)&in_RDI->pos_,(long)iVar11);
      pAVar6 = std::
               unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
               ::operator->((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                             *)0x1ad8c8);
      uVar2 = (*pAVar6->_vptr_AttributesDecoderInterface[3])(pAVar6,in_RDI[1].data_size_);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    for (vVar10 = 0; vVar10 < (int)(uint)local_11; vVar10 = vVar10 + 1) {
      std::
      vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                    *)&in_RDI->pos_,(long)vVar10);
      pAVar6 = std::
               unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
               ::operator->((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                             *)0x1ad92b);
      iVar3 = (*pAVar6->_vptr_AttributesDecoderInterface[6])();
      for (uVar2 = 0; (int)uVar2 < iVar3; uVar2 = uVar2 + 1) {
        std::
        vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
        ::operator[]((vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                      *)&in_RDI->pos_,(long)vVar10);
        pAVar6 = std::
                 unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                 ::operator->((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                               *)0x1ad969);
        iVar4 = (*pAVar6->_vptr_AttributesDecoderInterface[5])(pAVar6,(ulong)uVar2);
        uVar5 = (ulong)iVar4;
        sVar7 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&(in_RDI->bit_decoder_).bit_offset_)
        ;
        vVar9 = vVar10;
        if (sVar7 <= uVar5) {
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar11,vVar10),
                     CONCAT44(iVar3,uVar2));
          vVar9 = vVar10;
        }
        vVar10 = vVar9;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&(in_RDI->bit_decoder_).bit_offset_
                            ,(long)iVar4);
        *pvVar8 = vVar9;
      }
    }
    uVar5 = (**(code **)(in_RDI->data_ + 0x38))();
    if ((uVar5 & 1) == 0) {
      local_1 = false;
    }
    else {
      uVar5 = (**(code **)(in_RDI->data_ + 0x40))();
      if ((uVar5 & 1) == 0) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PointCloudDecoder::DecodePointAttributes() {
  uint8_t num_attributes_decoders;
  if (!buffer_->Decode(&num_attributes_decoders)) {
    return false;
  }
  // Create all attribute decoders. This is implementation specific and the
  // derived classes can use any data encoded in the
  // PointCloudEncoder::EncodeAttributesEncoderIdentifier() call.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    if (!CreateAttributesDecoder(i)) {
      return false;
    }
  }

  // Initialize all attributes decoders. No data is decoded here.
  for (auto &att_dec : attributes_decoders_) {
    if (!att_dec->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Decode any data needed by the attribute decoders.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    if (!attributes_decoders_[i]->DecodeAttributesDecoderData(buffer_)) {
      return false;
    }
  }

  // Create map between attribute and decoder ids.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    const int32_t num_attributes = attributes_decoders_[i]->GetNumAttributes();
    for (int j = 0; j < num_attributes; ++j) {
      int att_id = attributes_decoders_[i]->GetAttributeId(j);
      if (att_id >= attribute_to_decoder_map_.size()) {
        attribute_to_decoder_map_.resize(att_id + 1);
      }
      attribute_to_decoder_map_[att_id] = i;
    }
  }

  // Decode the actual attributes using the created attribute decoders.
  if (!DecodeAllAttributes()) {
    return false;
  }

  if (!OnAttributesDecoded()) {
    return false;
  }
  return true;
}